

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConsequenceFinder.cpp
# Opt level: O2

int __thiscall Saturation::ConsequenceFinder::init(ConsequenceFinder *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  long lVar1;
  SmartPtr<Lib::SubscriptionObject> SStack_28;
  
  this->_sa = (SaturationAlgorithm *)ctx;
  lVar1 = (**(code **)(*(long *)ctx + 0x20))(ctx);
  Lib::SingleParamEvent<Kernel::Clause_*>::subscribe<Saturation::ConsequenceFinder>
            ((SingleParamEvent<Kernel::Clause_*> *)&SStack_28,(ConsequenceFinder *)(lVar1 + 8),
             (offset_in_ConsequenceFinder_to_subr)this);
  Lib::SmartPtr<Lib::SubscriptionObject>::operator=(&this->_sdInsertion,&SStack_28);
  Lib::SmartPtr<Lib::SubscriptionObject>::~SmartPtr(&SStack_28);
  Lib::SingleParamEvent<Kernel::Clause_*>::subscribe<Saturation::ConsequenceFinder>
            ((SingleParamEvent<Kernel::Clause_*> *)&SStack_28,(ConsequenceFinder *)(lVar1 + 0x10),
             (offset_in_ConsequenceFinder_to_subr)this);
  Lib::SmartPtr<Lib::SubscriptionObject>::operator=(&this->_sdRemoval,&SStack_28);
  Lib::SmartPtr<Lib::SubscriptionObject>::~SmartPtr(&SStack_28);
  return extraout_EAX;
}

Assistant:

void ConsequenceFinder::init(SaturationAlgorithm* sa)
{
  _sa=sa;

  ClauseContainer* cc=_sa->getSimplifyingClauseContainer();
  _sdInsertion = cc->addedEvent.subscribe(this,&ConsequenceFinder::onClauseInserted);
  _sdRemoval = cc->removedEvent.subscribe(this,&ConsequenceFinder::onClauseRemoved);
}